

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O0

bool capnp::anon_unknown_2::Indent::canPrintAllInline(Array<kj::StringTree> *items,PrintKind kind)

{
  bool bVar1;
  StringTree *pSVar2;
  size_t sVar3;
  StringTree *item;
  StringTree *__end2;
  StringTree *__begin2;
  Array<kj::StringTree> *__range2;
  size_t totalSize;
  PrintKind kind_local;
  Array<kj::StringTree> *items_local;
  
  __range2 = (Array<kj::StringTree> *)0x0;
  __end2 = kj::Array<kj::StringTree>::begin(items);
  pSVar2 = kj::Array<kj::StringTree>::end(items);
  while( true ) {
    if (__end2 == pSVar2) {
      return true;
    }
    bVar1 = canPrintInline(__end2);
    if (!bVar1) break;
    if (kind == RECORD) {
      sVar3 = kj::StringTree::size(__end2);
      __range2 = (Array<kj::StringTree> *)((long)&__range2->ptr + sVar3);
      if ((Array<kj::StringTree> *)0x40 < __range2) {
        return false;
      }
    }
    __end2 = __end2 + 1;
  }
  return false;
}

Assistant:

static bool canPrintAllInline(const kj::Array<kj::StringTree>& items, PrintKind kind) {
    size_t totalSize = 0;
    for (auto& item: items) {
      if (!canPrintInline(item)) return false;
      if (kind == PrintKind::RECORD) {
        totalSize += item.size();
        if (totalSize > maxInlineRecordSize) return false;
      }
    }
    return true;
  }